

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdD3D56TlvUv::~MthdD3D56TlvUv(MthdD3D56TlvUv *this)

{
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (fin)
			insrt(orig.notify, 0, 1, 0);
		if (cls == 0x48 && fin) {
			// XXX: test me
			exp.valid[0] = 0;
			exp.valid[1] = 0;
			skip = true;
		}
	}